

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cpp
# Opt level: O2

void __thiscall
pstore::exchange::export_ns::emit_database(export_ns *this,database *db,ostream *os,bool comments)

{
  index_pointer node;
  indent iVar1;
  indent iVar2;
  undefined4 uVar3;
  element_type *peVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  int __fd;
  uint uVar8;
  ostream_base *poVar9;
  typed_address<pstore::trailer> tVar10;
  undefined7 in_register_00000009;
  size_t sVar11;
  diff_out<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_SNSystems[P]pstore_lib_exchange_export_cpp:56:29)>
  out;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *extraout_RDX;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *__buf_11;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *__buf_12;
  void *extraout_RDX_04;
  void *pvVar12;
  void *__buf_13;
  void *__buf_14;
  void *__buf_15;
  void *__buf_16;
  void *__buf_17;
  void *__buf_18;
  void *__buf_19;
  void *extraout_RDX_05;
  void *__buf_20;
  void *__buf_21;
  int __fd_00;
  pointer ptVar13;
  ulong uVar14;
  generation_iterator __first;
  generation_iterator __last;
  bool comments_00;
  bool first;
  indent object_indent;
  indent ind;
  indent local_160;
  undefined4 local_15c;
  indent local_158;
  indent local_154;
  shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  debug_line_headers;
  indent object_indent_1;
  vector<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
  f;
  string local_118;
  shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  *local_f8;
  export_ns *local_f0;
  string local_e8;
  ulong local_c0;
  pointer local_b8;
  shared_ptr<const_pstore::trailer> footer;
  string_mapping string_table;
  string_mapping path_table;
  
  sVar11 = CONCAT71(in_register_00000009,comments);
  local_15c = SUB84(os,0);
  string_mapping::string_mapping<(pstore::trailer::indices)3>(&string_table,this);
  string_mapping::string_mapping<(pstore::trailer::indices)4>(&path_table,this);
  ind.distance_ = 1;
  ostream_base::write((ostream_base *)db,0x123988,__buf,sVar11);
  poVar9 = operator<<((ostream_base *)db,&ind);
  poVar9 = (ostream_base *)ostream_base::write(poVar9,0x12398b,__buf_00,sVar11);
  ostream_base::write(poVar9,10,__buf_01,sVar11);
  poVar9 = operator<<((ostream_base *)db,&ind);
  poVar9 = (ostream_base *)ostream_base::write(poVar9,0x123998,__buf_02,sVar11);
  local_e8._M_dataplus._M_p = *(pointer *)(*(long *)(this + 0x48) + 0x10);
  local_e8._M_string_length = *(undefined8 *)(*(long *)(this + 0x48) + 0x18);
  uuid::str_abi_cxx11_(&local_118,(uuid *)&local_e8);
  poVar9 = (ostream_base *)ostream_base::write(poVar9,(int)&local_118,__buf_03,sVar11);
  ostream_base::write(poVar9,0x12399f,__buf_04,sVar11);
  std::__cxx11::string::~string((string *)&local_118);
  poVar9 = operator<<((ostream_base *)db,&ind);
  ostream_base::write(poVar9,0x1239a3,__buf_05,sVar11);
  uVar7 = database::get_current_revision((database *)this);
  f.
  super__Vector_base<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  f.
  super__Vector_base<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  f.
  super__Vector_base<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
  ::reserve(&f,(ulong)(uVar7 + 1));
  local_118._M_dataplus._M_p = (pointer)this;
  __first = generation_container::begin((generation_container *)&local_118);
  __last = generation_container::end((generation_container *)&local_118);
  tVar10 = __last.pos_.a_.a_;
  std::__copy_move<false,false,std::input_iterator_tag>::
  __copy_m<pstore::generation_iterator,std::back_insert_iterator<std::vector<pstore::typed_address<pstore::trailer>,std::allocator<pstore::typed_address<pstore::trailer>>>>>
            (__first,__last,&f);
  if ((long)f.
            super__Vector_base<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)f.
            super__Vector_base<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 3 != (ulong)(uVar7 + 1)) {
    assert_failed("footers.size () == num_transactions",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/exchange/export.cpp"
                  ,0x25);
  }
  std::
  __reverse<__gnu_cxx::__normal_iterator<pstore::typed_address<pstore::trailer>*,std::vector<pstore::typed_address<pstore::trailer>,std::allocator<pstore::typed_address<pstore::trailer>>>>>
            ();
  ptVar13 = f.
            super__Vector_base<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  iVar2 = ind;
  local_b8 = f.
             super__Vector_base<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (f.
      super__Vector_base<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      f.
      super__Vector_base<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
      ._M_impl.super__Vector_impl_data._M_start ||
      (long)f.
            super__Vector_base<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)f.
            super__Vector_base<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
            ._M_impl.super__Vector_impl_data._M_start < 0) {
    assert_failed("std::distance (std::begin (f), std::end (f)) >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/exchange/export.cpp"
                  ,0x67);
  }
  uVar14 = (ulong)ind.distance_;
  local_158.distance_ = 0;
  ostream_base::write((ostream_base *)db,0x123de2,__buf_06,(size_t)tVar10.a_.a_);
  uVar3 = local_15c;
  __fd_00 = 0x1230f0;
  __fd = 0x1230f0;
  pvVar12 = extraout_RDX;
  local_c0 = uVar14;
  do {
    ptVar13 = ptVar13 + 1;
    if (ptVar13 == local_b8) {
      poVar9 = (ostream_base *)
               ostream_base::write((ostream_base *)db,__fd,pvVar12,(size_t)tVar10.a_.a_);
      poVar9 = operator<<(poVar9,&local_158);
      ostream_base::write(poVar9,0x123cb3,__buf_20,(size_t)tVar10.a_.a_);
      ostream_base::write((ostream_base *)db,0x123a42,__buf_21,(size_t)tVar10.a_.a_);
      std::
      _Vector_base<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
      ::~_Vector_base(&f.
                       super__Vector_base<pstore::typed_address<pstore::trailer>,_std::allocator<pstore::typed_address<pstore::trailer>_>_>
                     );
      std::
      _Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&path_table);
      std::
      _Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&string_table);
      return;
    }
    poVar9 = (ostream_base *)
             ostream_base::write((ostream_base *)db,__fd_00,pvVar12,(size_t)tVar10.a_.a_);
    ostream_base::write(poVar9,10,__buf_07,(size_t)tVar10.a_.a_);
    local_160.distance_ = iVar2.distance_ + 1;
    database::getro<pstore::trailer,void>((database *)&footer,(typed_address<pstore::trailer>)this);
    uVar7 = ((footer.super___shared_ptr<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            a).generation.super___atomic_base<unsigned_int>._M_i;
    database::sync((database *)this);
    poVar9 = operator<<((ostream_base *)db,&local_160);
    ostream_base::write(poVar9,0x123988,__buf_08,(size_t)tVar10.a_.a_);
    object_indent.distance_ = local_160.distance_ + 1;
    if ((char)local_15c != '\0') {
      poVar9 = operator<<((ostream_base *)db,&object_indent);
      poVar9 = (ostream_base *)ostream_base::write(poVar9,0x123de4,__buf_09,(size_t)tVar10.a_.a_);
      poVar9 = ostream_base::write<unsigned_int,void>(poVar9,uVar7);
      ostream_base::write(poVar9,10,__buf_10,(size_t)tVar10.a_.a_);
    }
    iVar1.distance_ = object_indent.distance_;
    std::__cxx11::string::string((string *)&local_e8,"names",(allocator *)&debug_line_headers);
    anon_unknown.dwarf_5a2a5::prefix(&local_118,false,iVar1,&local_e8);
    comments_00 = SUB41(uVar3,0);
    bVar5 = emit_strings<(pstore::trailer::indices)3>
                      ((ostream_base *)db,iVar1,(database *)this,uVar7,&local_118,&string_table,
                       comments_00);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_e8);
    iVar1 = object_indent;
    std::__cxx11::string::string((string *)&local_e8,"paths",(allocator *)&debug_line_headers);
    anon_unknown.dwarf_5a2a5::prefix(&local_118,bVar5,iVar1,&local_e8);
    out.fn_ = (anon_class_48_6_94d7406f *)(ulong)uVar7;
    bVar6 = emit_strings<(pstore::trailer::indices)4>
                      ((ostream_base *)db,iVar1,(database *)this,uVar7,&local_118,&path_table,
                       comments_00);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_e8);
    if (bVar5 || bVar6) {
      ostream_base::write((ostream_base *)db,0x1239a0,__buf_11,(size_t)out.fn_);
    }
    iVar1.distance_ = object_indent.distance_;
    local_154.distance_ = object_indent.distance_;
    index::
    get_index<(pstore::trailer::indices)1,pstore::database_const,pstore::index::hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>const>
              ((index *)&debug_line_headers,(database *)this,true);
    bVar5 = index::
            hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
            ::empty(debug_line_headers.
                    super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr);
    peVar4 = debug_line_headers.
             super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if (bVar5) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&debug_line_headers.
                  super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    }
    else {
      if (uVar7 == 0) {
        assert_failed("generation > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/exchange/export.cpp"
                      ,0x35);
      }
      first = true;
      object_indent_1.distance_ = iVar1.distance_ + 1;
      local_118._M_dataplus._M_p = &first;
      local_118.field_2._M_allocated_capacity = (size_type)&local_154;
      local_118.field_2._8_8_ = &object_indent_1;
      local_f8 = &debug_line_headers;
      local_118._M_string_length = (size_type)db;
      local_f0 = this;
      uVar8 = database::get_current_revision((database *)this);
      pvVar12 = extraout_RDX_00;
      if (uVar7 - 1 <= uVar8) {
        tVar10 = database::older_revision_footer_pos((database *)this,uVar7 - 1);
        local_e8.field_2._M_allocated_capacity = (long)tVar10.a_.a_ + 0x70;
        local_e8._M_string_length = (size_type)peVar4;
        node = peVar4->root_;
        out.fn_ = (anon_class_48_6_94d7406f *)this;
        pvVar12 = extraout_RDX_01;
        local_e8._M_dataplus._M_p = (pointer)this;
        if (node.internal_ != (internal_node *)0x0) {
          out.fn_ = (anon_class_48_6_94d7406f *)&local_118;
          diff_details::
          traverser<pstore::index::hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
          ::
          visit_node<pstore::exchange::export_ns::diff_out<(anonymous_namespace)::emit_debug_line_headers(pstore::exchange::export_ns::ostream&,pstore::exchange::export_ns::indent,pstore::database_const&,unsigned_int)::__0>>
                    ((traverser<pstore::index::hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
                      *)&local_e8,node,0,out);
          pvVar12 = extraout_RDX_02;
        }
      }
      if (first == false) {
        poVar9 = (ostream_base *)ostream_base::write((ostream_base *)db,10,pvVar12,(size_t)out.fn_);
        poVar9 = operator<<(poVar9,&local_154);
        ostream_base::write(poVar9,0x123e0f,__buf_12,(size_t)out.fn_);
        bVar5 = first;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&debug_line_headers.
                    super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        pvVar12 = extraout_RDX_04;
        if ((bVar5 & 1U) == 0) goto LAB_0010ca5a;
      }
      else {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&debug_line_headers.
                    super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<unsigned_char>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        pvVar12 = extraout_RDX_03;
      }
      ostream_base::write((ostream_base *)db,0x1239a0,pvVar12,(size_t)out.fn_);
    }
LAB_0010ca5a:
    poVar9 = operator<<((ostream_base *)db,&object_indent);
    ostream_base::write(poVar9,0x123e01,__buf_13,(size_t)out.fn_);
    sVar11 = (size_t)uVar7;
    emit_fragments((ostream *)db,(indent)(object_indent.distance_ + 1),(database *)this,uVar7,
                   &string_table,comments_00);
    poVar9 = (ostream_base *)ostream_base::write((ostream_base *)db,10,__buf_14,sVar11);
    poVar9 = operator<<(poVar9,&object_indent);
    ostream_base::write(poVar9,0x123e0f,__buf_15,sVar11);
    poVar9 = operator<<((ostream_base *)db,&object_indent);
    ostream_base::write(poVar9,0x123e13,__buf_16,sVar11);
    tVar10.a_.a_ = (address)(ulong)uVar7;
    emit_compilation_index
              ((ostream_base *)db,(indent)(object_indent.distance_ + 1),(database *)this,uVar7,
               &string_table,comments_00);
    poVar9 = (ostream_base *)
             ostream_base::write((ostream_base *)db,10,__buf_17,(size_t)tVar10.a_.a_);
    poVar9 = operator<<(poVar9,&object_indent);
    ostream_base::write(poVar9,0x123a43,__buf_18,(size_t)tVar10.a_.a_);
    poVar9 = operator<<((ostream_base *)db,&local_160);
    ostream_base::write(poVar9,0x7d,__buf_19,(size_t)tVar10.a_.a_);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&footer.super___shared_ptr<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    local_158.distance_ = (uint)local_c0;
    __fd_00 = 0x123996;
    __fd = 0x1230ef;
    pvVar12 = extraout_RDX_05;
  } while( true );
}

Assistant:

void emit_database (database & db, ostream & os, bool const comments) {
                string_mapping string_table{db, name_index_tag ()};
                string_mapping path_table{db, path_index_tag ()};

                auto const ind = indent{}.next ();
                os << "{\n";
                os << ind << R"("version":1,)" << '\n';
                os << ind << R"("id":")" << db.get_header ().id ().str () << "\",\n";
                os << ind << R"("transactions":)";

                auto const f = footers (db);
                PSTORE_ASSERT (std::distance (std::begin (f), std::end (f)) >= 1);
                emit_array (
                    os, ind, std::next (std::begin (f)), std::end (f),
                    [&] (ostream & os1, indent const ind1,
                         pstore::typed_address<pstore::trailer> const footer_pos) {
                        auto const footer = db.getro (footer_pos);
                        unsigned const generation = footer->a.generation;
                        db.sync (generation);
                        os1 << ind1 << "{\n";
                        auto const object_indent = ind1.next ();
                        if (comments) {
                            os1 << object_indent << "// transaction #" << generation << '\n';
                        }
                        bool const names_emitted = emit_strings<trailer::indices::name> (
                            os1, object_indent, db, generation,
                            prefix (false, object_indent, "names"), &string_table, comments);
                        bool const paths_emitted = emit_strings<trailer::indices::path> (
                            os1, object_indent, db, generation,
                            prefix (names_emitted, object_indent, "paths"), &path_table, comments);
                        if (paths_emitted || names_emitted) {
                            os1 << ",\n";
                        }
                        if (emit_debug_line_headers (os1, object_indent, db, generation)) {
                            os1 << ",\n";
                        }
                        os1 << object_indent << R"("fragments":{)";
                        emit_fragments (os1, object_indent.next (), db, generation, string_table,
                                        comments);
                        os1 << '\n' << object_indent << "},\n";
                        os1 << object_indent << R"("compilations":{)";
                        emit_compilation_index (os1, object_indent.next (), db, generation,
                                                string_table, comments);
                        os1 << '\n' << object_indent << "}\n";
                        os1 << ind1 << '}';
                    });
                os << "\n}\n";
            }